

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv__is_cifs_or_smb(int fd)

{
  int iVar1;
  int iVar2;
  statfs s;
  
  iVar1 = fstatfs(fd,(statfs *)&s);
  iVar2 = 0;
  if (iVar1 != -1) {
    iVar2 = 1;
    if ((((int)s.f_type != -0x1acb2be) && ((int)s.f_type != -0xacb2be)) && ((int)s.f_type != 0x517b)
       ) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int uv__is_cifs_or_smb(int fd) {
  struct statfs s;

  if (-1 == fstatfs(fd, &s))
    return 0;

  switch ((unsigned) s.f_type) {
  case 0x0000517Bu:  /* SMB */
  case 0xFE534D42u:  /* SMB2 */
  case 0xFF534D42u:  /* CIFS */
    return 1;
  }

  return 0;
}